

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav_init_file(drwav *pWav,char *filename)

{
  FILE *pUserData;
  FILE *pFile;
  char *filename_local;
  drwav *pWav_local;
  
  pUserData = fopen(filename,"rb");
  if (pUserData == (FILE *)0x0) {
    pWav_local._4_4_ = 0;
  }
  else {
    pWav_local._4_4_ = drwav_init(pWav,drwav__on_read_stdio,drwav__on_seek_stdio,pUserData);
  }
  return pWav_local._4_4_;
}

Assistant:

drwav_bool32 drwav_init_file(drwav* pWav, const char* filename) {
    FILE* pFile;
#if defined(_MSC_VER) && _MSC_VER >= 1400
    if (fopen_s(&pFile, filename, "rb") != 0) {
        return DRWAV_FALSE;
    }
#else
    pFile = fopen(filename, "rb");
    if (pFile == NULL) {
        return DRWAV_FALSE;
    }
#endif

    return drwav_init(pWav, drwav__on_read_stdio, drwav__on_seek_stdio, (void*)pFile);
}